

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast6.c
# Opt level: O2

word Extra_Truth6MinimumRoundOne(word t,int iVar,char *pCanonPerm,uint *pCanonPhase)

{
  uint uVar1;
  uint uVar2;
  word wVar3;
  word t_00;
  word wVar4;
  word t_01;
  word wVar5;
  word t_02;
  ulong uVar6;
  word wVar7;
  word wVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  if ((uint)iVar < 5) {
    wVar3 = Extra_Truth6ChangePhase(t,iVar);
    wVar8 = t;
    if (wVar3 < t) {
      wVar8 = wVar3;
    }
    t_00 = Extra_Truth6ChangePhase(t,iVar + 1);
    uVar9 = wVar8;
    if (t_00 < wVar8) {
      uVar9 = t_00;
    }
    wVar4 = Extra_Truth6ChangePhase(t_00,iVar);
    uVar10 = uVar9;
    if (wVar4 < uVar9) {
      uVar10 = wVar4;
    }
    t_01 = Extra_Truth6SwapAdjacent(t,iVar);
    uVar11 = uVar10;
    if (t_01 < uVar10) {
      uVar11 = t_01;
    }
    wVar5 = Extra_Truth6ChangePhase(t_01,iVar);
    uVar12 = uVar11;
    if (wVar5 < uVar11) {
      uVar12 = wVar5;
    }
    t_02 = Extra_Truth6ChangePhase(t_01,iVar + 1);
    uVar6 = uVar12;
    if (t_02 < uVar12) {
      uVar6 = t_02;
    }
    wVar7 = Extra_Truth6ChangePhase(t_02,iVar);
    if (wVar7 < uVar6) {
      uVar6 = wVar7;
      uVar2 = 7;
    }
    else {
      uVar2 = 2;
      if (wVar8 <= t_00) {
        uVar2 = (uint)(wVar3 < t);
      }
      uVar1 = 3;
      if (uVar9 <= wVar4) {
        uVar1 = uVar2;
      }
      uVar2 = 4;
      if (uVar10 <= t_01) {
        uVar2 = uVar1;
      }
      uVar1 = 6;
      if (uVar11 <= wVar5) {
        uVar1 = uVar2;
      }
      uVar2 = 5;
      if (uVar12 <= t_02) {
        uVar2 = uVar1;
      }
    }
    uVar2 = adjustInfoAfterSwap(pCanonPerm,*pCanonPhase,iVar,uVar2);
    *pCanonPhase = uVar2;
    return uVar6;
  }
  __assert_fail("iVar >= 0 && iVar < 5",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyFast6.c"
                ,0x69,"word Extra_Truth6MinimumRoundOne(word, int, char *, unsigned int *)");
}

Assistant:

word Extra_Truth6MinimumRoundOne( word t, int iVar, char* pCanonPerm, unsigned* pCanonPhase )
{
    word tCur, tMin = t; // ab 
    unsigned info =0;
    assert( iVar >= 0 && iVar < 5 );
    
    tCur = Extra_Truth6ChangePhase( t, iVar );    // !a b
    if(tCur<tMin)
    {
        info = 1;
        tMin = tCur;
    }
    tCur = Extra_Truth6ChangePhase( t, iVar+1 );  // a !b
    if(tCur<tMin)
    {
        info = 2;
        tMin = tCur;
    }
    tCur = Extra_Truth6ChangePhase( tCur, iVar ); // !a !b
    if(tCur<tMin)
    {
        info = 3;
        tMin = tCur;
    }
    
    t    = Extra_Truth6SwapAdjacent( t, iVar );   // b a
    if(t<tMin)
    {
        info = 4;
        tMin = t;
    }
    
    tCur = Extra_Truth6ChangePhase( t, iVar );    // !b a
    if(tCur<tMin)
    {
        info = 6;
        tMin = tCur;
    }
    tCur = Extra_Truth6ChangePhase( t, iVar+1 );  // b !a
    if(tCur<tMin)
    {
        info = 5;
        tMin = tCur;
    }
    tCur = Extra_Truth6ChangePhase( tCur, iVar ); // !b !a
    if(tCur<tMin)
    {
        (* pCanonPhase) = adjustInfoAfterSwap(pCanonPerm, * pCanonPhase, iVar, 7);
        return tCur;
    }
    else
    {
        (* pCanonPhase) = adjustInfoAfterSwap(pCanonPerm, * pCanonPhase, iVar, info);
        return tMin;
    }
}